

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestTestHandler::AddTest
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  cmCTest *pcVar2;
  pointer pbVar3;
  size_t sVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  pointer pbVar8;
  ostringstream cmCTestLog_msg_3;
  cmCTestTestProperties test;
  long *local_580;
  long local_570 [2];
  undefined1 local_560 [16];
  _func_int *local_550 [12];
  ios_base local_4f0 [264];
  undefined1 local_3e8 [72];
  _Alloc_hider local_3a0;
  size_type local_398;
  undefined1 local_380 [312];
  bool local_248;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e8,"Add test: ",10);
  pbVar8 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_3e8,(pbVar8->_M_dataplus)._M_p,pbVar8->_M_string_length);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar2,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x9cf,(char *)local_560._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((_func_int **)local_560._0_8_ != local_550) {
    operator_delete((void *)local_560._0_8_,(ulong)(local_550[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
  std::ios_base::~ios_base((ios_base *)(local_380 + 8));
  if (((this->UseExcludeRegExpFlag != true) || (this->UseExcludeRegExpFirst != true)) ||
     (bVar5 = cmsys::RegularExpression::find
                        (&this->ExcludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p,
                         &(this->ExcludeTestsRegularExpression).regmatch), !bVar5)) {
    pbVar8 = (this->CustomTestsIgnore).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (this->CustomTestsIgnore).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this->MemCheck == true) {
      if (pbVar8 != pbVar3) {
        sVar4 = pbVar1->_M_string_length;
        do {
          if ((pbVar8->_M_string_length == sVar4) &&
             ((sVar4 == 0 ||
              (iVar6 = bcmp((pbVar8->_M_dataplus)._M_p,(pbVar1->_M_dataplus)._M_p,sVar4), iVar6 == 0
              )))) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3e8,"Ignore memcheck: ",0x11);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_3e8,(pbVar8->_M_dataplus)._M_p,
                                pbVar8->_M_string_length);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar2,5,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x9e1,(char *)local_560._0_8_,(this->super_cmCTestGenericHandler).Quiet);
LAB_001aca52:
            if ((_func_int **)local_560._0_8_ != local_550) {
              operator_delete((void *)local_560._0_8_,(ulong)(local_550[0] + 1));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e8);
            std::ios_base::~ios_base((ios_base *)(local_380 + 8));
            return true;
          }
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != pbVar3);
      }
    }
    else if (pbVar8 != pbVar3) {
      sVar4 = pbVar1->_M_string_length;
      do {
        if ((pbVar8->_M_string_length == sVar4) &&
           ((sVar4 == 0 ||
            (iVar6 = bcmp((pbVar8->_M_dataplus)._M_p,(pbVar1->_M_dataplus)._M_p,sVar4), iVar6 == 0))
           )) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3e8,"Ignore test: ",0xd);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_3e8,(pbVar8->_M_dataplus)._M_p,
                              pbVar8->_M_string_length);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar2,5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                       ,0x9f0,(char *)local_560._0_8_,(this->super_cmCTestGenericHandler).Quiet);
          goto LAB_001aca52;
        }
        pbVar8 = pbVar8 + 1;
      } while (pbVar8 != pbVar3);
    }
    cmCTestTestProperties::cmCTestTestProperties((cmCTestTestProperties *)local_3e8);
    std::__cxx11::string::_M_assign((string *)(local_3e8 + 0x28));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_380,args);
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&local_3a0,(string *)local_560);
    if ((_func_int **)local_560._0_8_ != local_550) {
      operator_delete((void *)local_560._0_8_,(ulong)(local_550[0] + 1));
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_560);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_560,"Set test directory: ",0x14);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_560,local_3a0._M_p,local_398);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x9fb,(char *)local_580,(this->super_cmCTestGenericHandler).Quiet);
    if (local_580 != local_570) {
      operator_delete(local_580,local_570[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_560);
    std::ios_base::~ios_base(local_4f0);
    if ((this->UseIncludeRegExpFlag == true) &&
       ((bVar5 = cmsys::RegularExpression::find
                           (&this->IncludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p,
                            &(this->IncludeTestsRegularExpression).regmatch), !bVar5 ||
        ((this->UseExcludeRegExpFirst == false &&
         (bVar5 = cmsys::RegularExpression::find
                            (&this->ExcludeTestsRegularExpression,(pbVar1->_M_dataplus)._M_p,
                             &(this->ExcludeTestsRegularExpression).regmatch), bVar5)))))) {
      local_248 = false;
    }
    std::
    vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
    ::push_back(&this->TestList,(value_type *)local_3e8);
    cmCTestTestProperties::~cmCTestTestProperties((cmCTestTestProperties *)local_3e8);
  }
  return true;
}

Assistant:

bool cmCTestTestHandler::AddTest(const std::vector<std::string>& args)
{
  const std::string& testname = args[0];
  cmCTestOptionalLog(this->CTest, DEBUG, "Add test: " << args[0] << std::endl,
                     this->Quiet);

  if (this->UseExcludeRegExpFlag && this->UseExcludeRegExpFirst &&
      this->ExcludeTestsRegularExpression.find(testname)) {
    return true;
  }
  if (this->MemCheck) {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore memcheck: " << *it << std::endl, this->Quiet);
      return true;
    }
  } else {
    std::vector<std::string>::iterator it;
    bool found = false;
    for (it = this->CustomTestsIgnore.begin();
         it != this->CustomTestsIgnore.end(); ++it) {
      if (*it == testname) {
        found = true;
        break;
      }
    }
    if (found) {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "Ignore test: " << *it << std::endl, this->Quiet);
      return true;
    }
  }

  cmCTestTestProperties test;
  test.Name = testname;
  test.Args = args;
  test.Directory = cmSystemTools::GetCurrentWorkingDirectory();
  cmCTestOptionalLog(this->CTest, DEBUG,
                     "Set test directory: " << test.Directory << std::endl,
                     this->Quiet);

  if (this->UseIncludeRegExpFlag &&
      (!this->IncludeTestsRegularExpression.find(testname) ||
       (!this->UseExcludeRegExpFirst &&
        this->ExcludeTestsRegularExpression.find(testname)))) {
    test.IsInBasedOnREOptions = false;
  }
  this->TestList.push_back(test);
  return true;
}